

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

int __thiscall Buffer::Allocate(Buffer *this,string *FileName,int FileOff)

{
  list<int,_std::allocator<int>_> *plVar1;
  size_t *psVar2;
  char *pcVar3;
  Block *this_00;
  int iVar4;
  pointer pcVar5;
  _List_node_base *p_Var6;
  ostream *poVar7;
  long lVar8;
  long *local_50 [2];
  long local_40 [2];
  
  p_Var6 = (this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var6 == (_List_node_base *)&this->Empty_Block) {
    plVar1 = &this->Occupy_Block;
    p_Var6 = (_List_node_base *)plVar1;
    do {
      p_Var6 = p_Var6->_M_next;
      if (p_Var6 == (_List_node_base *)plVar1) break;
    } while (this->Pin[*(int *)&p_Var6[1]._M_next] != 0);
    if (p_Var6 == (_List_node_base *)plVar1) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Blocks are not enough!");
      std::endl<char,std::char_traits<char>>(poVar7);
      system("pause");
      exit(1);
    }
    lVar8 = 0x2832028;
    if (this->Dirty[*(int *)&p_Var6[1]._M_next] == 1) {
      Block::WriteFile(this->buffer + *(int *)&p_Var6[1]._M_next);
    }
  }
  else {
    lVar8 = 0x2832010;
  }
  iVar4 = *(int *)&p_Var6[1]._M_next;
  pcVar3 = this->buffer[0].data + lVar8 + -0x24;
  *(long *)pcVar3 = *(long *)pcVar3 + -1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var6,0x18);
  this_00 = this->buffer + iVar4;
  std::__cxx11::string::_M_replace
            ((ulong)this_00,0,(char *)this->buffer[iVar4].FileName._M_string_length,0x1493a5);
  this->buffer[iVar4].FileOff = -1;
  memset(this->buffer[iVar4].data,0,0x2000);
  pcVar5 = (FileName->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar5,pcVar5 + FileName->_M_string_length);
  std::__cxx11::string::_M_assign((string *)this_00);
  this_00->FileOff = FileOff;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  Block::ReadFile(this_00);
  p_Var6 = (_List_node_base *)operator_new(0x18);
  *(int *)&p_Var6[1]._M_next = iVar4;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar2 = &(this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
  ;
  *psVar2 = *psVar2 + 1;
  this->Dirty[iVar4] = 0;
  this->Pin[iVar4] = 1;
  return iVar4;
}

Assistant:

int Buffer::Allocate(string FileName, int FileOff) {
	int pos;
	if (this->Empty_Block.empty()) {
		//û�пտ飬ֻ�ܸ���LRUԭ���滻
		list<int>::iterator it;
		for (it = this->Occupy_Block.begin(); it != this->Occupy_Block.end(); it++) {
			if (Pin[*it] == 0)	break;				//�ҵ���Զ�޸���û�������Ŀ�
		}
		if (it == this->Occupy_Block.end()) {
			cout << "Blocks are not enough!" << endl;
			system("pause");
			exit(1);
		}
		if (Dirty[*it] == 1) {
			this->buffer[*it].WriteFile();			//���޸ģ���д�ش���
		}
		pos = *it;
		it = this->Occupy_Block.erase(it);
	}
	else {
		//���пտ飬ȡ������
		pos = this->Empty_Block.front();
		this->Empty_Block.pop_front();
	}
	this->buffer[pos].BlockClear();					//��ոÿ�
	this->buffer[pos].BlockSet(FileName, FileOff);
	this->buffer[pos].ReadFile();
	this->Occupy_Block.push_back(pos);
	this->UnDirt(pos);
	this->Lock(pos);							//����������һ�θ��µ���֮ǰ���ñ��滻��ȥ
	return pos;
}